

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

void GetQuadTreeVisibilityList(QuadTreeNode *TriTree,Level *Lvl,BoundingBox *ScrBounder)

{
  int iVar1;
  int iVar2;
  Level *in_RDX;
  QuadTreeNode *in_RSI;
  BoundingBox *in_RDI;
  int c;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = Separated(in_RDI,(BoundingBox *)in_RDX);
  if (iVar1 == 0) {
    if (in_RDI[1].BR.Pos[1] == 0.0) {
      in_RDI[2].TL.Pos[0] = in_RSI[1].Bounder.TL.Pos[0];
      in_RSI[1].Bounder.TL.Pos[0] = (double)in_RDI;
    }
    else {
      iVar1 = 4;
      while (iVar2 = iVar1 + -1, iVar1 != 0) {
        GetQuadTreeVisibilityList
                  (in_RSI,in_RDX,(BoundingBox *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
        iVar1 = iVar2;
      }
    }
  }
  return;
}

Assistant:

static void GetQuadTreeVisibilityList(struct QuadTreeNode *TriTree,
                               struct Level *Lvl,
                               struct BoundingBox *ScrBounder)
{
   int c;

   /*

      if the view window doesn't overlap this node then do nothing

    */
   if (Separated(&TriTree->Bounder, ScrBounder))
      return;

   /*

      if this node has children, consider them instead

    */
   if (TriTree->Children) {
      c = 4;
      while (c--)
         GetQuadTreeVisibilityList(&TriTree->Children[c], Lvl, ScrBounder);
   } else {
      /*

         otherwise, add to draw list

       */
      TriTree->Next = Lvl->VisibleList;
      Lvl->VisibleList = TriTree;
   }
}